

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLSolver::DestroyAutoStub(NLSolver *this)

{
  NLUtils *pNVar1;
  pointer pcVar2;
  error_code ec;
  path local_48;
  
  if ((this->pathstr_)._M_string_length != 0) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_48,&this->pathstr_,auto_format);
    std::filesystem::remove_all(&local_48,&ec);
    std::filesystem::__cxx11::path::~path(&local_48);
    if (ec._M_value != 0) {
      pNVar1 = this->p_ut_;
      pcVar2 = (this->pathstr_)._M_dataplus._M_p;
      (**(code **)(*(long *)ec._M_cat + 0x20))(&local_48);
      (*pNVar1->_vptr_NLUtils[4])
                (pNVar1,"Failed to remove temp dir \'%s\': %s",pcVar2,
                 local_48._M_pathname._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return;
}

Assistant:

void NLSolver::DestroyAutoStub() {
  // delete temp folder if created
  if (pathstr_.size()) {
    std::error_code ec;
    std::filesystem::remove_all(pathstr_, ec);
    if (ec)
      Utils().log_warning("Failed to remove temp dir '%s': %s",
                          pathstr_.c_str(), ec.message().c_str());
  }
}